

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O3

void __thiscall
CoverageAnnotator_crossComponentConnectionAndMappingIds_Test::
~CoverageAnnotator_crossComponentConnectionAndMappingIds_Test
          (CoverageAnnotator_crossComponentConnectionAndMappingIds_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CoverageAnnotator, crossComponentConnectionAndMappingIds)
{
    auto model = libcellml::Model::create("model");

    auto component1 = libcellml::Component::create("component1");
    auto component2 = libcellml::Component::create("component2");
    auto component3 = libcellml::Component::create("component3");

    auto variable1 = libcellml::Variable::create("variable1");
    auto variable2 = libcellml::Variable::create("variable2");
    auto variable3 = libcellml::Variable::create("variable3");

    model->addComponent(component1);
    model->addComponent(component2);
    model->addComponent(component3);

    component1->addVariable(variable1);
    component2->addVariable(variable2);
    component3->addVariable(variable3);

    libcellml::Variable::addEquivalence(variable1, variable2);
    libcellml::Variable::addEquivalence(variable1, variable3);

    libcellml::Variable::setEquivalenceMappingId(variable1, variable2, "mapping_id");
    libcellml::Variable::setEquivalenceMappingId(variable1, variable3, "mapping_id");

    libcellml::Variable::setEquivalenceConnectionId(variable1, variable2, "connection_id");
    libcellml::Variable::setEquivalenceConnectionId(variable1, variable3, "connection_id");

    auto annotator = libcellml::Annotator::create();

    annotator->setModel(model);

    EXPECT_EQ(size_t(2), annotator->itemCount("mapping_id"));
    EXPECT_EQ(size_t(2), annotator->itemCount("connection_id"));
}